

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSamplerStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::SamplerStateQueryTests::init
          (SamplerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  TestContext *pTVar2;
  RenderContext *pRVar3;
  TestNode *pTVar4;
  char *pcVar5;
  TestNode *node;
  undefined8 extraout_RAX;
  undefined8 uVar6;
  anon_struct_24_4_699f403a *paVar7;
  QueryType QVar8;
  long lVar9;
  TesterType TVar10;
  allocator<char> local_d9;
  TestNode *local_d8;
  TestNode *local_d0;
  anon_struct_24_4_699f403a *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  TestNode *local_a0;
  long local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"set_value",
             "Set value and query it");
  local_d8 = pTVar4;
  local_d0 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar9 = 0;
  while (lVar9 != 0xe) {
    local_98 = lVar9;
    if (init::states[lVar9].newInGLES31 == true) {
      local_c8 = init::states + lVar9;
      TVar10 = init::states[lVar9].tester;
      local_a0 = (TestNode *)(ulong)TVar10;
      if (TVar10 - TESTER_TEXTURE_WRAP_S_CLAMP_TO_BORDER < 3) {
        pcVar1 = local_c8->name;
        for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 4) {
          QVar8 = *(QueryType *)((long)init::nonPureVerifiers + lVar9);
          pTVar2 = local_d0->m_testCtx;
          pRVar3 = ((Context *)local_d0[1]._vptr_TestNode)->m_renderCtx;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          local_c0._M_string_length = 0;
          local_c0.field_2._M_local_buf[0] = '\0';
          std::operator+(&local_90,&local_c0,pcVar1);
          pcVar5 = getVerifierSuffix(QVar8);
          std::operator+(&local_70,&local_90,pcVar5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,local_c8->desc,&local_d9);
          pTVar4 = &gls::TextureStateQueryTests::createSamplerParamTest
                              (pTVar2,pRVar3,&local_70,&local_50,QVar8,(TesterType)local_a0)->
                    super_TestNode;
          tcu::TestNode::addChild(local_d8,pTVar4);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_c0);
        }
      }
      else if (TVar10 == TESTER_TEXTURE_BORDER_COLOR) {
        pcVar1 = local_c8->name;
        for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 4) {
          QVar8 = *(QueryType *)((long)init::vectorVerifiers + lVar9);
          pTVar2 = local_d0->m_testCtx;
          pRVar3 = ((Context *)local_d0[1]._vptr_TestNode)->m_renderCtx;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          local_c0._M_string_length = 0;
          local_c0.field_2._M_local_buf[0] = '\0';
          std::operator+(&local_90,&local_c0,pcVar1);
          pcVar5 = getVerifierSuffix(QVar8);
          std::operator+(&local_70,&local_90,pcVar5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,local_c8->desc,&local_d9);
          pTVar4 = &gls::TextureStateQueryTests::createSamplerParamTest
                              (pTVar2,pRVar3,&local_70,&local_50,QVar8,TESTER_TEXTURE_BORDER_COLOR)
                    ->super_TestNode;
          tcu::TestNode::addChild(local_d8,pTVar4);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_c0);
        }
      }
      else {
        pcVar1 = local_c8->name;
        for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 4) {
          QVar8 = *(QueryType *)((long)init::scalarVerifiers + lVar9);
          pTVar2 = local_d0->m_testCtx;
          pRVar3 = ((Context *)local_d0[1]._vptr_TestNode)->m_renderCtx;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          local_c0._M_string_length = 0;
          local_c0.field_2._M_local_buf[0] = '\0';
          std::operator+(&local_90,&local_c0,pcVar1);
          pcVar5 = getVerifierSuffix(QVar8);
          std::operator+(&local_70,&local_90,pcVar5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,local_c8->desc,&local_d9);
          pTVar4 = &gls::TextureStateQueryTests::createSamplerParamTest
                              (pTVar2,pRVar3,&local_70,&local_50,QVar8,(TesterType)local_a0)->
                    super_TestNode;
          tcu::TestNode::addChild(local_d8,pTVar4);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_c0);
        }
      }
    }
    lVar9 = local_98 + 1;
  }
  uVar6 = 0xe;
  lVar9 = 0;
  while (pTVar4 = local_d0, lVar9 != 2) {
    node = (TestNode *)operator_new(0x70);
    local_98 = lVar9;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,pTVar4->m_testCtx,init::pureSetters[lVar9].name,
               init::pureSetters[lVar9].desc);
    local_a0 = node;
    tcu::TestNode::addChild(pTVar4,node);
    QVar8 = init::pureSetters[lVar9].verifier;
    local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,QVar8);
    paVar7 = (anon_struct_24_4_699f403a *)0x0;
    uVar6 = extraout_RAX;
    while (paVar7 != (anon_struct_24_4_699f403a *)0xf0) {
      if (QVar8 == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER) {
        TVar10 = *(TesterType *)((long)&paVar7[0x6b251].desc + 4);
      }
      else {
        TVar10 = TESTER_LAST;
        if (QVar8 == QUERY_SAMPLER_PARAM_PURE_INTEGER) {
          TVar10 = *(TesterType *)&paVar7[0x6b251].desc;
        }
      }
      pTVar2 = local_d0->m_testCtx;
      pRVar3 = (RenderContext *)local_d0[1]._vptr_TestNode[1];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      std::operator+(&local_70,&local_90,*(char **)&paVar7[0x6b250].tester);
      local_c8 = paVar7;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,paVar7[0x6b251].name,(allocator<char> *)&local_50);
      QVar8 = (QueryType)local_d8;
      pTVar4 = &gls::TextureStateQueryTests::createSamplerParamTest
                          (pTVar2,pRVar3,&local_70,&local_c0,(QueryType)local_d8,TVar10)->
                super_TestNode;
      tcu::TestNode::addChild(local_a0,pTVar4);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_70);
      uVar6 = std::__cxx11::string::~string((string *)&local_90);
      paVar7 = local_c8 + 1;
    }
    lVar9 = local_98 + 1;
  }
  return (int)uVar6;
}

Assistant:

void SamplerStateQueryTests::init (void)
{
	using namespace gls::TextureStateQueryTests;

	static const QueryType scalarVerifiers[] =
	{
		QUERY_SAMPLER_PARAM_INTEGER,
		QUERY_SAMPLER_PARAM_FLOAT,
		QUERY_SAMPLER_PARAM_PURE_INTEGER,
		QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER,
	};
	static const QueryType nonPureVerifiers[] =
	{
		QUERY_SAMPLER_PARAM_INTEGER,
		QUERY_SAMPLER_PARAM_FLOAT,
	};
	static const QueryType vectorVerifiers[] =
	{
		QUERY_SAMPLER_PARAM_INTEGER_VEC4,
		QUERY_SAMPLER_PARAM_FLOAT_VEC4,
		QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4,
		QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4,
	};

#define FOR_EACH_VERIFIER(VERIFIERS, X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(VERIFIERS); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix((VERIFIERS)[verifierNdx]);			\
		const QueryType verifier = (VERIFIERS)[verifierNdx];								\
		targetGroup->addChild(X);															\
	}

	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	tester;
		bool		newInGLES31;
	} states[] =
	{
		{ "texture_wrap_s",					"TEXTURE_WRAP_S",					TESTER_TEXTURE_WRAP_S,					false	},
		{ "texture_wrap_t",					"TEXTURE_WRAP_T",					TESTER_TEXTURE_WRAP_T,					false	},
		{ "texture_wrap_r",					"TEXTURE_WRAP_R",					TESTER_TEXTURE_WRAP_R,					false	},
		{ "texture_mag_filter",				"TEXTURE_MAG_FILTER",				TESTER_TEXTURE_MAG_FILTER,				false	},
		{ "texture_min_filter",				"TEXTURE_MIN_FILTER",				TESTER_TEXTURE_MIN_FILTER,				false	},
		{ "texture_min_lod",				"TEXTURE_MIN_LOD",					TESTER_TEXTURE_MIN_LOD,					false	},
		{ "texture_max_lod",				"TEXTURE_MAX_LOD",					TESTER_TEXTURE_MAX_LOD,					false	},
		{ "texture_compare_mode",			"TEXTURE_COMPARE_MODE",				TESTER_TEXTURE_COMPARE_MODE,			false	},
		{ "texture_compare_func",			"TEXTURE_COMPARE_FUNC",				TESTER_TEXTURE_COMPARE_FUNC,			false	},
		{ "texture_srgb_decode",			"TEXTURE_SRGB_DECODE_EXT",			TESTER_TEXTURE_SRGB_DECODE_EXT,			true	},
		{ "texture_border_color",			"TEXTURE_BORDER_COLOR",				TESTER_TEXTURE_BORDER_COLOR,			true	},
		{ "texture_wrap_s_clamp_to_border",	"TEXTURE_WRAP_S_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_S_CLAMP_TO_BORDER,	true	},
		{ "texture_wrap_t_clamp_to_border",	"TEXTURE_WRAP_T_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_T_CLAMP_TO_BORDER,	true	},
		{ "texture_wrap_r_clamp_to_border",	"TEXTURE_WRAP_R_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER,	true	},
	};
	static const struct
	{
		const char* name;
		const char* desc;
		QueryType	verifier;
	} pureSetters[] =
	{
		{ "set_pure_int",	"Set state with pure int",			QUERY_SAMPLER_PARAM_PURE_INTEGER			},
		{ "set_pure_uint",	"Set state with pure unsigned int",	QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER	},
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	intTester;
		TesterType	uintTester;
	} pureStates[] =
	{
		{ "texture_wrap_s",					"TEXTURE_WRAP_S",					TESTER_TEXTURE_WRAP_S_SET_PURE_INT,				TESTER_TEXTURE_WRAP_S_SET_PURE_UINT					},
		{ "texture_wrap_t",					"TEXTURE_WRAP_T",					TESTER_TEXTURE_WRAP_T_SET_PURE_INT,				TESTER_TEXTURE_WRAP_T_SET_PURE_UINT					},
		{ "texture_wrap_r",					"TEXTURE_WRAP_R",					TESTER_TEXTURE_WRAP_R_SET_PURE_INT,				TESTER_TEXTURE_WRAP_R_SET_PURE_UINT					},
		{ "texture_mag_filter",				"TEXTURE_MAG_FILTER",				TESTER_TEXTURE_MAG_FILTER_SET_PURE_INT,			TESTER_TEXTURE_MAG_FILTER_SET_PURE_UINT				},
		{ "texture_min_filter",				"TEXTURE_MIN_FILTER",				TESTER_TEXTURE_MIN_FILTER_SET_PURE_INT,			TESTER_TEXTURE_MIN_FILTER_SET_PURE_UINT				},
		{ "texture_min_lod",				"TEXTURE_MIN_LOD",					TESTER_TEXTURE_MIN_LOD_SET_PURE_INT,			TESTER_TEXTURE_MIN_LOD_SET_PURE_UINT				},
		{ "texture_max_lod",				"TEXTURE_MAX_LOD",					TESTER_TEXTURE_MAX_LOD_SET_PURE_INT,			TESTER_TEXTURE_MAX_LOD_SET_PURE_UINT				},
		{ "texture_compare_mode",			"TEXTURE_COMPARE_MODE",				TESTER_TEXTURE_COMPARE_MODE_SET_PURE_INT,		TESTER_TEXTURE_COMPARE_MODE_SET_PURE_UINT			},
		{ "texture_compare_func",			"TEXTURE_COMPARE_FUNC",				TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_INT,		TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_UINT			},
		{ "texture_srgb_decode",			"TEXTURE_SRGB_DECODE_EXT",			TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_INT,	TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_UINT		},
		// \note texture_border_color is already checked
		// \note texture_wrap_*_clamp_to_border brings no additional coverage
	};

	// set_value
	{
		tcu::TestCaseGroup* const targetGroup = new tcu::TestCaseGroup(m_testCtx, "set_value", "Set value and query it");
		addChild(targetGroup);

		for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(states); ++stateNdx)
		{
			// already tested in gles3
			if (!states[stateNdx].newInGLES31)
				continue;

			if (isExtendedParamQuery(states[stateNdx].tester))
			{
				// no need to cover for all getters if the only thing new is the param name
				FOR_EACH_VERIFIER(nonPureVerifiers, createSamplerParamTest(m_testCtx,
																		   m_context.getRenderContext(),
																		   std::string() + states[stateNdx].name + verifierSuffix,
																		   states[stateNdx].desc,
																		   verifier,
																		   states[stateNdx].tester));
			}
			else if (isIsVectorQuery(states[stateNdx].tester))
			{
				FOR_EACH_VERIFIER(vectorVerifiers, createSamplerParamTest(m_testCtx,
																		  m_context.getRenderContext(),
																		  std::string() + states[stateNdx].name + verifierSuffix,
																		  states[stateNdx].desc,
																		  verifier,
																		  states[stateNdx].tester));
			}
			else
			{
				FOR_EACH_VERIFIER(scalarVerifiers, createSamplerParamTest(m_testCtx,
																		  m_context.getRenderContext(),
																		  std::string() + states[stateNdx].name + verifierSuffix,
																		  states[stateNdx].desc,
																		  verifier,
																		  states[stateNdx].tester));
			}
		}
	}

#undef FOR_EACH_VERIFIER

	// set_pure_uint
	// set_pure_int
	for (int setterNdx = 0; setterNdx < DE_LENGTH_OF_ARRAY(pureSetters); ++setterNdx)
	{
		tcu::TestCaseGroup* const targetGroup = new tcu::TestCaseGroup(m_testCtx, pureSetters[setterNdx].name, pureSetters[setterNdx].desc);
		addChild(targetGroup);

		for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(pureStates); ++stateNdx)
		{
			const TesterType	tester	= (pureSetters[setterNdx].verifier == QUERY_SAMPLER_PARAM_PURE_INTEGER)				? (pureStates[stateNdx].intTester)
										: (pureSetters[setterNdx].verifier == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER)	? (pureStates[stateNdx].uintTester)
										: (TESTER_LAST);

			targetGroup->addChild(createSamplerParamTest(m_testCtx,
														 m_context.getRenderContext(),
														 std::string() + pureStates[stateNdx].name,
														 pureStates[stateNdx].desc,
														 pureSetters[setterNdx].verifier,
														 tester));
		}
	}
}